

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void __thiscall JsonBoolean_False_Test::JsonBoolean_False_Test(JsonBoolean_False_Test *this)

{
  JsonBoolean_False_Test *this_local;
  
  anon_unknown.dwarf_94447::JsonBoolean::JsonBoolean(&this->super_JsonBoolean);
  (this->super_JsonBoolean).super_Json.super_Test._vptr_Test =
       (_func_int **)&PTR__JsonBoolean_False_Test_00259a10;
  return;
}

Assistant:

TEST_F (JsonBoolean, False) {
    StrictMock<mock_json_callbacks> callbacks;
    callbacks_proxy<mock_json_callbacks> proxy (callbacks);
    EXPECT_CALL (callbacks, boolean_value (false)).Times (1);

    json::parser<decltype (proxy)> p = json::make_parser (proxy);
    p.input (" false "s);
    p.eof ();
    EXPECT_FALSE (p.has_error ());
}